

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderhacks.cpp
# Opt level: O0

void __thiscall FDrawInfo::ClearBuffers(FDrawInfo *this)

{
  gl_subsectorrendernode *pgVar1;
  uint uVar2;
  gl_subsectorrendernode **ppgVar3;
  gl_subsectorrendernode *n_1;
  gl_subsectorrendernode *node_1;
  uint i_1;
  gl_subsectorrendernode *n;
  gl_subsectorrendernode *node;
  uint i;
  FDrawInfo *this_local;
  
  node._4_4_ = 0;
  while( true ) {
    uVar2 = TArray<gl_subsectorrendernode_*,_gl_subsectorrendernode_*>::Size
                      (&this->otherfloorplanes);
    if (uVar2 <= node._4_4_) break;
    ppgVar3 = TArray<gl_subsectorrendernode_*,_gl_subsectorrendernode_*>::operator[]
                        (&this->otherfloorplanes,(ulong)node._4_4_);
    n = *ppgVar3;
    while (n != (gl_subsectorrendernode *)0x0) {
      pgVar1 = n->next;
      FreeList<gl_subsectorrendernode>::Release((FreeList<gl_subsectorrendernode> *)&SSR_List,n);
      n = pgVar1;
    }
    node._4_4_ = node._4_4_ + 1;
  }
  TArray<gl_subsectorrendernode_*,_gl_subsectorrendernode_*>::Clear(&this->otherfloorplanes);
  node_1._4_4_ = 0;
  while( true ) {
    uVar2 = TArray<gl_subsectorrendernode_*,_gl_subsectorrendernode_*>::Size
                      (&this->otherceilingplanes);
    if (uVar2 <= node_1._4_4_) break;
    ppgVar3 = TArray<gl_subsectorrendernode_*,_gl_subsectorrendernode_*>::operator[]
                        (&this->otherceilingplanes,(ulong)node_1._4_4_);
    n_1 = *ppgVar3;
    while (n_1 != (gl_subsectorrendernode *)0x0) {
      pgVar1 = n_1->next;
      FreeList<gl_subsectorrendernode>::Release((FreeList<gl_subsectorrendernode> *)&SSR_List,n_1);
      n_1 = pgVar1;
    }
    node_1._4_4_ = node_1._4_4_ + 1;
  }
  TArray<gl_subsectorrendernode_*,_gl_subsectorrendernode_*>::Clear(&this->otherceilingplanes);
  TArray<FDrawInfo::MissingTextureInfo,_FDrawInfo::MissingTextureInfo>::Clear
            (&this->MissingUpperTextures);
  TArray<FDrawInfo::MissingTextureInfo,_FDrawInfo::MissingTextureInfo>::Clear
            (&this->MissingLowerTextures);
  TArray<FDrawInfo::MissingSegInfo,_FDrawInfo::MissingSegInfo>::Clear(&this->MissingUpperSegs);
  TArray<FDrawInfo::MissingSegInfo,_FDrawInfo::MissingSegInfo>::Clear(&this->MissingLowerSegs);
  TArray<FDrawInfo::SubsectorHackInfo,_FDrawInfo::SubsectorHackInfo>::Clear(&this->SubsectorHacks);
  TArray<sector_t_*,_sector_t_*>::Clear(&this->CeilingStacks);
  TArray<sector_t_*,_sector_t_*>::Clear(&this->FloorStacks);
  TArray<subsector_t_*,_subsector_t_*>::Clear(&this->HandledSubsectors);
  return;
}

Assistant:

void FDrawInfo::ClearBuffers()
{
	for(unsigned int i=0;i< otherfloorplanes.Size();i++)
	{
		gl_subsectorrendernode * node = otherfloorplanes[i];
		while (node)
		{
			gl_subsectorrendernode * n = node;
			node = node->next;
			SSR_List.Release(n);
		}
	}
	otherfloorplanes.Clear();

	for(unsigned int i=0;i< otherceilingplanes.Size();i++)
	{
		gl_subsectorrendernode * node = otherceilingplanes[i];
		while (node)
		{
			gl_subsectorrendernode * n = node;
			node = node->next;
			SSR_List.Release(n);
		}
	}
	otherceilingplanes.Clear();

	// clear all the lists that might not have been cleared already
	MissingUpperTextures.Clear();
	MissingLowerTextures.Clear();
	MissingUpperSegs.Clear();
	MissingLowerSegs.Clear();
	SubsectorHacks.Clear();
	CeilingStacks.Clear();
	FloorStacks.Clear();
	HandledSubsectors.Clear();

}